

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::GetActiveDataset
          (Error *__return_storage_ptr__,CommissionerApp *this,ActiveOperationalDataset *aDataset,
          uint16_t aDatasetFlags)

{
  bool bVar1;
  element_type *peVar2;
  Error *aError;
  ErrorCode local_60 [4];
  Error local_50;
  undefined1 local_23;
  uint16_t local_22;
  ActiveOperationalDataset *pAStack_20;
  uint16_t aDatasetFlags_local;
  ActiveOperationalDataset *aDataset_local;
  CommissionerApp *this_local;
  Error *error;
  
  local_23 = 0;
  local_22 = aDatasetFlags;
  pAStack_20 = aDataset;
  aDataset_local = (ActiveOperationalDataset *)this;
  this_local = (CommissionerApp *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  peVar2 = std::
           __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mCommissioner);
  (*peVar2->_vptr_Commissioner[0x1a])(&local_50,peVar2,pAStack_20,(ulong)local_22);
  aError = Error::operator=(__return_storage_ptr__,&local_50);
  local_60[0] = kNone;
  bVar1 = commissioner::operator!=(aError,local_60);
  Error::~Error(&local_50);
  if (!bVar1) {
    MergeDataset(&this->mActiveDataset,pAStack_20);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetActiveDataset(ActiveOperationalDataset &aDataset, uint16_t aDatasetFlags)
{
    Error error;

    SuccessOrExit(error = mCommissioner->GetActiveDataset(aDataset, aDatasetFlags));
    MergeDataset(mActiveDataset, aDataset);

exit:
    return error;
}